

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O3

GLboolean __thiscall
glcts::TextureBufferBufferParameters::queryBufferParameteriv
          (TextureBufferBufferParameters *this,GLenum target,GLenum pname,GLint expected_data)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  bool bVar2;
  GLint result;
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b4 = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x7a8))(target,pname,&local_1b4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Could not query for value of buffer object\'s parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x74);
  bVar2 = local_1b4 == expected_data;
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glGetBufferParameteriv(pname == ",0x20);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") returned ",0xb);
    std::ostream::operator<<(this_00,local_1b4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," which is not equal to expected value ",0x26);
    std::ostream::operator<<(this_00,expected_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return bVar2;
}

Assistant:

glw::GLboolean TextureBufferBufferParameters::queryBufferParameteriv(glw::GLenum target, glw::GLenum pname,
																	 glw::GLint expected_data)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint	 result	  = -1;
	glw::GLboolean test_passed = true;

	gl.getBufferParameteriv(target, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query for value of buffer object's parameter!");

	if (result != expected_data)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetBufferParameteriv(pname == " << pname << ") returned "
						   << result << " which is not equal to expected value " << expected_data << "."
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}